

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::transpose(mat3 *m)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  float_t fVar4;
  float_t fVar5;
  float_t fVar6;
  float_t fVar7;
  float_t fVar8;
  float_t fVar9;
  mat3 *in_RDI;
  
  fVar1 = m->m[1].x;
  fVar2 = m->m[2].x;
  fVar3 = m->m[0].x;
  fVar4 = m->m[0].y;
  fVar5 = m->m[1].y;
  fVar6 = m->m[2].y;
  fVar7 = m->m[0].z;
  fVar8 = m->m[1].z;
  fVar9 = m->m[2].z;
  in_RDI->m[0].x = 0.0;
  in_RDI->m[0].y = 0.0;
  *(undefined8 *)&in_RDI->m[0].z = 0;
  in_RDI->m[1].y = 0.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[0].x = fVar3;
  in_RDI->m[0].y = fVar1;
  in_RDI->m[0].z = fVar2;
  in_RDI->m[1].x = fVar4;
  in_RDI->m[1].y = fVar5;
  in_RDI->m[1].z = fVar6;
  in_RDI->m[2].x = fVar7;
  in_RDI->m[2].y = fVar8;
  in_RDI->m[2].z = fVar9;
  return in_RDI;
}

Assistant:

mat3 transpose(const mat3& m)
{
    return mat3(M00(m), M10(m), M20(m),
                M01(m), M11(m), M21(m),
                M02(m), M12(m), M22(m));
}